

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O3

void __thiscall
IlmThread_3_4::anon_unknown_5::DefaultThreadPoolProvider::finish(DefaultThreadPoolProvider *this)

{
  undefined8 uVar1;
  int iVar2;
  mutex *__mutex;
  
  __mutex = &((this->_data).
              super___shared_ptr<IlmThread_3_4::(anonymous_namespace)::DefaultThreadPoolData,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_threadMutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    lockedFinish(this);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void
DefaultThreadPoolProvider::finish ()
{
    std::lock_guard<std::mutex> lock (_data->_threadMutex);

    lockedFinish ();
}